

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::SwapBuffersWithDamageTests::init(SwapBuffersWithDamageTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *pEVar1;
  undefined8 uVar2;
  ResizeType RVar3;
  int extraout_EAX;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  size_type sVar6;
  _anonymous_namespace_ *p_Var7;
  SwapBuffersWithDamageTest *this_00;
  reference pvVar8;
  TestNode *pTVar9;
  ResizeType resizeType_00;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *frameDrawType;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *frameDrawType_00;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *frameDrawType_01;
  string local_210;
  undefined1 local_1f0 [8];
  string name_2;
  size_t drawTypeNdx_2;
  undefined1 local_1a8 [8];
  string name_1;
  size_t drawTypeNdx_1;
  string name;
  size_t drawTypeNdx;
  string local_150;
  TestCaseGroup *local_130;
  TestCaseGroup *resizeGroup;
  ulong uStack_120;
  ResizeType resizeType;
  size_t resizeTypeNdx;
  value_type local_110;
  allocator<deqp::egl::(anonymous_namespace)::DrawType> local_f1;
  value_type local_f0;
  allocator<deqp::egl::(anonymous_namespace)::DrawType> local_d5;
  value_type local_d4;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  local_d0;
  allocator<deqp::egl::(anonymous_namespace)::DrawType> local_b5;
  value_type local_b4;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  local_b0;
  allocator<deqp::egl::(anonymous_namespace)::DrawType> local_95;
  value_type local_94;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  local_90;
  allocator<deqp::egl::(anonymous_namespace)::DrawType> local_65;
  value_type local_64;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  local_60;
  undefined1 local_48 [8];
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  frameDrawTypes;
  ResizeType resizeTypes [3];
  DrawType renderClear [2];
  DrawType clearRender [2];
  SwapBuffersWithDamageTests *this_local;
  
  renderClear[0] = DRAWTYPE_GLES2_CLEAR;
  renderClear[1] = DRAWTYPE_GLES2_RENDER;
  stack0xffffffffffffffe0 = 1;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100000000;
  resizeTypes[0] = RESIZETYPE_AFTER_SWAP;
  clearRender = (DrawType  [2])this;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::vector((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
            *)local_48);
  local_64 = DRAWTYPE_GLES2_CLEAR;
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::allocator(&local_65);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::vector(&local_60,1,&local_64,&local_65);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               *)local_48,&local_60);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~vector(&local_60);
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::~allocator(&local_65);
  local_94 = DRAWTYPE_GLES2_RENDER;
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::allocator(&local_95);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::vector(&local_90,1,&local_94,&local_95);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               *)local_48,&local_90);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~vector(&local_90);
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::~allocator(&local_95);
  local_b4 = DRAWTYPE_GLES2_CLEAR;
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::allocator(&local_b5);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::vector(&local_b0,2,&local_b4,&local_b5);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               *)local_48,&local_b0);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~vector(&local_b0);
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::~allocator(&local_b5);
  local_d4 = DRAWTYPE_GLES2_RENDER;
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::allocator(&local_d5);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::vector(&local_d0,2,&local_d4,&local_d5);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               *)local_48,&local_d0);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~vector(&local_d0);
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::~allocator(&local_d5);
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::allocator(&local_f1);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
              *)&local_f0,renderClear,clearRender,&local_f1);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               *)local_48,&local_f0);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~vector(&local_f0);
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::~allocator(&local_f1);
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::allocator
            ((allocator<deqp::egl::(anonymous_namespace)::DrawType> *)((long)&resizeTypeNdx + 7));
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
              *)&local_110,resizeTypes + 2,renderClear,
             (allocator<deqp::egl::(anonymous_namespace)::DrawType> *)((long)&resizeTypeNdx + 7));
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               *)local_48,&local_110);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~vector(&local_110);
  std::allocator<deqp::egl::(anonymous_namespace)::DrawType>::~allocator
            ((allocator<deqp::egl::(anonymous_namespace)::DrawType> *)((long)&resizeTypeNdx + 7));
  for (uStack_120 = 0; uStack_120 < 3; uStack_120 = uStack_120 + 1) {
    resizeGroup._4_4_ = resizeTypes[uStack_120 - 2];
    pTVar4 = (TestCaseGroup *)operator_new(0x78);
    pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
    egl::(anonymous_namespace)::generateResizeGroupName_abi_cxx11_
              (&local_150,(_anonymous_namespace_ *)(ulong)resizeGroup._4_4_,resizeType_00);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    TestCaseGroup::TestCaseGroup(pTVar4,pEVar1,pcVar5,"");
    std::__cxx11::string::~string((string *)&local_150);
    name.field_2._8_8_ = 0;
    local_130 = pTVar4;
    while( true ) {
      uVar2 = name.field_2._8_8_;
      sVar6 = std::
              vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
              ::size((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                      *)local_48);
      if (sVar6 <= (ulong)uVar2) break;
      p_Var7 = (_anonymous_namespace_ *)
               std::
               vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               ::operator[]((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                             *)local_48,name.field_2._8_8_);
      egl::(anonymous_namespace)::generateTestName_abi_cxx11_
                ((string *)&drawTypeNdx_1,p_Var7,frameDrawType);
      pTVar4 = local_130;
      this_00 = (SwapBuffersWithDamageTest *)operator_new(0x1af8);
      pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
      pvVar8 = std::
               vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               ::operator[]((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                             *)local_48,name.field_2._8_8_);
      RVar3 = resizeGroup._4_4_;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      egl::anon_unknown_0::SwapBuffersWithDamageTest::SwapBuffersWithDamageTest
                (this_00,pEVar1,pvVar8,4,RVar3,pcVar5,"");
      tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&drawTypeNdx_1);
      name.field_2._8_8_ = name.field_2._8_8_ + 1;
    }
    name_1.field_2._8_8_ = 0;
    while( true ) {
      uVar2 = name_1.field_2._8_8_;
      sVar6 = std::
              vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
              ::size((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                      *)local_48);
      if (sVar6 <= (ulong)uVar2) break;
      p_Var7 = (_anonymous_namespace_ *)
               std::
               vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               ::operator[]((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                             *)local_48,name_1.field_2._8_8_);
      egl::(anonymous_namespace)::generateTestName_abi_cxx11_
                ((string *)&drawTypeNdx_2,p_Var7,frameDrawType_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "preserve_buffer_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &drawTypeNdx_2);
      std::__cxx11::string::~string((string *)&drawTypeNdx_2);
      pTVar4 = local_130;
      pTVar9 = (TestNode *)operator_new(0x1af8);
      pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
      pvVar8 = std::
               vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               ::operator[]((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                             *)local_48,name_1.field_2._8_8_);
      RVar3 = resizeGroup._4_4_;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      egl::anon_unknown_0::SwapBuffersWithDamageAndPreserveBufferTest::
      SwapBuffersWithDamageAndPreserveBufferTest
                ((SwapBuffersWithDamageAndPreserveBufferTest *)pTVar9,pEVar1,pvVar8,4,RVar3,pcVar5,
                 "");
      tcu::TestNode::addChild((TestNode *)pTVar4,pTVar9);
      std::__cxx11::string::~string((string *)local_1a8);
      name_1.field_2._8_8_ = name_1.field_2._8_8_ + 1;
    }
    name_2.field_2._8_8_ = 0;
    while( true ) {
      uVar2 = name_2.field_2._8_8_;
      sVar6 = std::
              vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
              ::size((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                      *)local_48);
      if (sVar6 <= (ulong)uVar2) break;
      p_Var7 = (_anonymous_namespace_ *)
               std::
               vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               ::operator[]((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                             *)local_48,name_2.field_2._8_8_);
      egl::(anonymous_namespace)::generateTestName_abi_cxx11_(&local_210,p_Var7,frameDrawType_01);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     "buffer_age_",&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      pTVar4 = local_130;
      pTVar9 = (TestNode *)operator_new(0x1af8);
      pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
      pvVar8 = std::
               vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
               ::operator[]((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                             *)local_48,name_2.field_2._8_8_);
      RVar3 = resizeGroup._4_4_;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      egl::anon_unknown_0::SwapBuffersWithDamageAndBufferAgeTest::
      SwapBuffersWithDamageAndBufferAgeTest
                ((SwapBuffersWithDamageAndBufferAgeTest *)pTVar9,pEVar1,pvVar8,4,RVar3,pcVar5,"");
      tcu::TestNode::addChild((TestNode *)pTVar4,pTVar9);
      std::__cxx11::string::~string((string *)local_1f0);
      name_2.field_2._8_8_ = name_2.field_2._8_8_ + 1;
    }
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)local_130);
  }
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::~vector((vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
             *)local_48);
  return extraout_EAX;
}

Assistant:

void SwapBuffersWithDamageTests::init (void)
{
	const DrawType clearRender[2] =
	{
		DRAWTYPE_GLES2_CLEAR,
		DRAWTYPE_GLES2_RENDER
	};

	const DrawType renderClear[2] =
	{
		DRAWTYPE_GLES2_RENDER,
		DRAWTYPE_GLES2_CLEAR
	};

	const ResizeType resizeTypes[] =
	{
		RESIZETYPE_NONE,
		RESIZETYPE_BEFORE_SWAP,
		RESIZETYPE_AFTER_SWAP
	};

	vector< vector<DrawType> > frameDrawTypes;
	frameDrawTypes.push_back(vector<DrawType> (1, DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<DrawType> (1, DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<DrawType> (2, DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<DrawType> (2, DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<DrawType> (DE_ARRAY_BEGIN(clearRender), DE_ARRAY_END(clearRender)));
	frameDrawTypes.push_back(vector<DrawType> (DE_ARRAY_BEGIN(renderClear), DE_ARRAY_END(renderClear)));

	for (size_t resizeTypeNdx = 0; resizeTypeNdx < DE_LENGTH_OF_ARRAY(resizeTypes); resizeTypeNdx++)
	{
		const ResizeType		resizeType	= resizeTypes[resizeTypeNdx];
		TestCaseGroup* const	resizeGroup	= new TestCaseGroup(m_eglTestCtx, generateResizeGroupName(resizeType).c_str(), "");

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(), ""));
		}

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = "preserve_buffer_" + generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageAndPreserveBufferTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(), ""));
		}

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = "buffer_age_" + generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageAndBufferAgeTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(),  ""));
		}

		addChild(resizeGroup);
	}
}